

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UBool __thiscall
icu_63::Normalizer2WithImpl::isNormalized
          (Normalizer2WithImpl *this,UnicodeString *s,UErrorCode *errorCode)

{
  short sVar1;
  int iVar2;
  char16_t *pcVar3;
  undefined4 extraout_var;
  int iVar4;
  bool bVar5;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  pcVar3 = UnicodeString::getBuffer(s);
  if (pcVar3 == (char16_t *)0x0) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    bVar5 = false;
  }
  else {
    sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (s->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    iVar2 = (*(this->super_Normalizer2).super_UObject._vptr_UObject[0x14])
                      (this,pcVar3,pcVar3 + iVar4,errorCode);
    bVar5 = pcVar3 + iVar4 == (char16_t *)CONCAT44(extraout_var,iVar2);
  }
  return bVar5;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }